

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Char * poolAppendString(STRING_POOL *pool,XML_Char *s)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *local_20;
  XML_Char *s_local;
  STRING_POOL *pool_local;
  
  local_20 = s;
  while( true ) {
    if (*local_20 == '\0') {
      return pool->start;
    }
    if ((pool->ptr == pool->end) && (iVar3 = poolGrow(pool), iVar3 == 0)) break;
    cVar1 = *local_20;
    pcVar2 = pool->ptr;
    pool->ptr = pcVar2 + 1;
    *pcVar2 = cVar1;
    local_20 = local_20 + 1;
  }
  return (XML_Char *)0x0;
}

Assistant:

static
const XML_Char *poolAppendString(STRING_POOL *pool, const XML_Char *s)
{
  while (*s) {
    if (!poolAppendChar(pool, *s))
      return 0;
    s++;
  } 
  return pool->start;
}